

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O1

void handle_device_fd(int fd)

{
  char cVar1;
  listnode *__s2;
  char *__s1;
  char *__s1_00;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  __pid_t _Var7;
  ssize_t sVar8;
  size_t sVar9;
  char *__path;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  listnode *plVar13;
  uint local_4e4;
  uint uid;
  mode_t perm;
  int local_4d8;
  int local_4d4;
  uevent uevent;
  char local_498 [96];
  char msg [1026];
  
  sVar8 = recv(fd,msg,0x400,0);
  iVar5 = (int)sVar8;
  do {
    if (iVar5 < 1) {
      return;
    }
    pcVar10 = msg;
    uVar4 = (uint)sVar8;
    if (uVar4 != 0x400) {
      msg[uVar4 & 0x7fffffff] = '\0';
      msg[uVar4 + 1] = '\0';
      uevent.action = "";
      uevent.path = "";
      uevent.subsystem = "";
      uevent.firmware = "";
      uevent.major = -1;
      uevent.minor = -1;
      __s1 = uevent.action;
      pcVar11 = uevent.path;
      __s1_00 = uevent.subsystem;
      uVar2 = uevent._32_8_;
      cVar1 = msg[0];
      while (uevent.action = __s1, uevent.path = pcVar11, uevent.subsystem = __s1_00,
            uevent._32_8_ = uVar2, cVar1 != '\0') {
        iVar5 = strncmp(pcVar10,"ACTION=",7);
        if (iVar5 == 0) {
          pcVar10 = pcVar10 + 7;
          uevent.action = pcVar10;
        }
        else {
          iVar5 = strncmp(pcVar10,"DEVPATH=",8);
          if (iVar5 == 0) {
            pcVar10 = pcVar10 + 8;
            uevent.path = pcVar10;
          }
          else {
            iVar5 = strncmp(pcVar10,"SUBSYSTEM=",10);
            if (iVar5 == 0) {
              pcVar10 = pcVar10 + 10;
              uevent.subsystem = pcVar10;
            }
            else {
              iVar5 = strncmp(pcVar10,"FIRMWARE=",9);
              if (iVar5 == 0) {
                pcVar10 = pcVar10 + 9;
                uevent.firmware = pcVar10;
              }
              else {
                iVar5 = strncmp(pcVar10,"MAJOR=",6);
                if (iVar5 == 0) {
                  pcVar10 = pcVar10 + 6;
                  iVar5 = atoi(pcVar10);
                  uevent.major = iVar5;
                }
                else {
                  iVar5 = strncmp(pcVar10,"MINOR=",6);
                  if (iVar5 == 0) {
                    pcVar10 = pcVar10 + 6;
                    iVar5 = atoi(pcVar10);
                    uevent.minor = iVar5;
                  }
                }
              }
            }
          }
        }
        do {
          cVar1 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while (cVar1 != '\0');
        __s1 = uevent.action;
        pcVar11 = uevent.path;
        __s1_00 = uevent.subsystem;
        uVar2 = uevent._32_8_;
        cVar1 = *pcVar10;
      }
      uevent.major = (int)uVar2;
      iVar5 = uevent.major;
      uevent.minor = (int)(uVar2 >> 0x20);
      iVar3 = uevent.minor;
      uVar12 = (ulong)(uint)uevent.minor;
      log_write(6,"<6>init: event { \'%s\', \'%s\', \'%s\', \'%s\', %d, %d }\n",__s1,pcVar11,__s1_00
                ,uevent.firmware,uVar2 & 0xffffffff,uVar12);
      if ((-1 < (iVar3 | iVar5)) && (pcVar10 = strrchr(pcVar11,0x2f), pcVar10 != (char *)0x0)) {
        pcVar11 = pcVar10 + 1;
        sVar9 = strlen(pcVar11);
        if (sVar9 < 0x41) {
          local_4d4 = strncmp(__s1_00,"block",5);
          if (local_4d4 == 0) {
            __path = "/dev/block/";
LAB_00107d8c:
            mkdir(__path,0x1ed);
          }
          else {
            iVar6 = strncmp(__s1_00,"graphics",8);
            if (iVar6 == 0) {
              __path = "/dev/graphics/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"oncrpc",6);
            if (iVar6 == 0) {
              __path = "/dev/oncrpc/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"adsp",4);
            if (iVar6 == 0) {
              __path = "/dev/adsp/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"msm_camera",10);
            if (iVar6 == 0) {
              __path = "/dev/msm_camera/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"input",5);
            if (iVar6 == 0) {
              __path = "/dev/input/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"mtd",3);
            if (iVar6 == 0) {
              __path = "/dev/mtd/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"sound",5);
            if (iVar6 == 0) {
              __path = "/dev/snd/";
              goto LAB_00107d8c;
            }
            iVar6 = strncmp(__s1_00,"misc",4);
            if (iVar6 == 0) {
              iVar6 = strncmp(pcVar11,"log_",4);
              __path = "/dev/";
              if (iVar6 == 0) {
                __path = "/dev/log/";
                mkdir("/dev/log/",0x1ed);
                pcVar11 = pcVar10 + 5;
              }
            }
            else {
              __path = "/dev/";
            }
          }
          snprintf(local_498,0x60,"%s%s",__path,pcVar11);
          iVar6 = strcmp(__s1,"add");
          if (iVar6 == 0) {
            if (iVar3 < 0x100 && iVar5 < 0x100) {
              iVar6 = get_device_perm_inner(qemu_perms,local_498,&uid,&local_4e4,&perm);
              uVar4 = perm;
              if ((iVar6 != 0) &&
                 (iVar6 = get_device_perm_inner(devperms,local_498,&uid,&local_4e4,&perm),
                 plVar13 = devperms_partners.next, uVar4 = perm, iVar6 != 0)) {
                for (; local_4d8 = fd, plVar13 != &devperms_partners; plVar13 = plVar13->next) {
                  __s2 = plVar13[-2].prev;
                  if (*(short *)((long)&plVar13[-1].prev + 4) == 0) {
                    iVar6 = strcmp(local_498,(char *)__s2);
                  }
                  else {
                    sVar9 = strlen((char *)__s2);
                    iVar6 = strncmp(local_498,(char *)__s2,sVar9);
                  }
                  fd = local_4d8;
                  if (iVar6 == 0) {
                    uid = *(uint *)((long)&plVar13[-1].next + 4);
                    local_4e4 = *(uint *)&plVar13[-1].prev;
                    uVar4 = *(uint *)&plVar13[-1].next;
                    goto LAB_00107ef1;
                  }
                }
                uid = 0;
                local_4e4 = 0;
                fd = local_4d8;
                uVar4 = 0x180;
              }
LAB_00107ef1:
              mknod(local_498,(uint)(local_4d4 == 0) << 0xe | uVar4 | 0x2000,
                    (long)(iVar5 << 8 | iVar3));
              chown(local_498,uid,local_4e4);
            }
          }
          else {
            iVar5 = strcmp(__s1,"remove");
            if (iVar5 == 0) {
              unlink(local_498);
            }
          }
        }
      }
      iVar5 = strcmp(__s1_00,"firmware");
      if (((iVar5 == 0) && (iVar5 = strcmp(__s1,"add"), iVar5 == 0)) && (_Var7 = fork(), _Var7 == 0)
         ) {
        process_firmware_event(&uevent);
        exit(0);
      }
    }
    sVar8 = recv(fd,msg,0x400,0);
    iVar5 = (int)sVar8;
  } while( true );
}

Assistant:

void handle_device_fd(int fd)
{
    char msg[UEVENT_MSG_LEN+2];
    int n;

    while((n = recv(fd, msg, UEVENT_MSG_LEN, 0)) > 0) {
        struct uevent uevent;

        if(n == UEVENT_MSG_LEN)   /* overflow -- discard */
            continue;

        msg[n] = '\0';
        msg[n+1] = '\0';

        parse_event(msg, &uevent);

        handle_device_event(&uevent);
        handle_firmware_event(&uevent);
    }
}